

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.h
# Opt level: O0

tensor * __thiscall
dlib::sgd::operator()
          (sgd *this,float learning_rate,avg_pool_<2L,_2L,_2,_2,_0,_0> *l,tensor *params_grad)

{
  size_t sVar1;
  ostream *poVar2;
  ostream *poVar3;
  string *a;
  avg_pool_<2L,_2L,_2,_2,_0,_0> *in_RSI;
  tensor *in_RDI;
  float in_XMM0_Da;
  double dVar4;
  tensor *src3;
  double wd;
  double lr;
  ostringstream dlib_o_out;
  tensor *params;
  float in_stack_fffffffffffffd9c;
  resizable_tensor *in_stack_fffffffffffffda0;
  avg_pool_<2L,_2L,_2,_2,_0,_0> *in_stack_fffffffffffffdb0;
  tensor *in_stack_fffffffffffffdb8;
  error_type t;
  resizable_tensor *in_stack_fffffffffffffdc0;
  ostringstream local_1a0 [376];
  tensor *local_28;
  float local_c;
  
  local_c = in_XMM0_Da;
  local_28 = avg_pool_<2L,_2L,_2,_2,_0,_0>::get_layer_params(in_RSI);
  sVar1 = tensor::size(local_28);
  if (sVar1 == 0) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = std::operator<<((ostream *)local_1a0,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2e);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_1a0,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/solvers.h"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_1a0,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "const tensor &dlib::sgd::operator()(const float, const layer_type &, const tensor &) [layer_type = dlib::avg_pool_<2, 2, 2, 2>]"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)local_1a0,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"params.size() != 0");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(local_1a0,std::boolalpha);
    poVar3 = std::operator<<(poVar2,"");
    std::operator<<(poVar3,"\n");
    t = (error_type)((ulong)poVar3 >> 0x20);
    a = (string *)__cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar2,t,a);
    __cxa_throw(a,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  sVar1 = tensor::size(in_RDI);
  if (sVar1 == 0) {
    resizable_tensor::copy_size(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    resizable_tensor::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
  }
  dVar4 = (double)local_c;
  get_learning_rate_multiplier<dlib::avg_pool_<2l,2l,2,2,0,0>>(in_stack_fffffffffffffdb0);
  src3 = (tensor *)(double)*(float *)&in_RDI[3].m_n;
  get_weight_decay_multiplier<dlib::avg_pool_<2l,2l,2,2,0,0>>(in_stack_fffffffffffffdb0);
  tt::affine_transform
            (&in_stack_fffffffffffffdc0->super_tensor,in_stack_fffffffffffffdb8,
             (tensor *)in_stack_fffffffffffffdb0,src3,(float)((ulong)dVar4 >> 0x20),SUB84(dVar4,0),
             in_stack_fffffffffffffd9c);
  return in_RDI;
}

Assistant:

const tensor& operator() (
            const float learning_rate,
            const layer_type& l,
            const tensor& params_grad
        )
        {
            const tensor& params = l.get_layer_params();

            DLIB_CASSERT(params.size() != 0);
            if (v.size() == 0)
            {
                v.copy_size(params_grad);
                v = 0;
            }

            const double lr = learning_rate*get_learning_rate_multiplier(l);
            const double wd = weight_decay*get_weight_decay_multiplier(l);
            
            //perform: v = momentum*mat(v) - wd*lr*mat(params) - lr*mat(params_grad);
            tt::affine_transform(v, v, params, params_grad, momentum, -wd*lr, -lr);

            return v;
        }